

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined8 *puVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_14b9;
  float local_14b8;
  int local_14b4;
  Ray *local_14b0;
  RTCIntersectArguments *local_14a8;
  Scene *local_14a0;
  Geometry *local_1498;
  ulong local_1490;
  ulong local_1488;
  ulong local_1480;
  ulong *local_1478;
  RayQueryContext *local_1470;
  long local_1468;
  long local_1460;
  undefined4 local_1458;
  undefined4 local_1454;
  undefined4 local_1450;
  undefined4 local_144c;
  undefined4 local_1448;
  undefined4 local_1444;
  uint local_1440;
  uint local_143c;
  uint local_1438;
  RTCFilterFunctionNArguments local_1428;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 *local_13a8;
  byte local_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  float fVar2;
  float fVar3;
  undefined1 auVar56 [64];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar5 = ray->tfar;
    if (0.0 <= fVar5) {
      local_1478 = local_11d0;
      aVar6 = (ray->dir).field_0;
      auVar49 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar28 = vandps_avx512vl((undefined1  [16])aVar6,auVar28);
      auVar29._8_4_ = 0x219392ef;
      auVar29._0_8_ = 0x219392ef219392ef;
      auVar29._12_4_ = 0x219392ef;
      uVar23 = vcmpps_avx512vl(auVar28,auVar29,1);
      auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar64 = ZEXT1664(auVar28);
      auVar28 = vdivps_avx512vl(auVar28,(undefined1  [16])aVar6);
      auVar29 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar27 = (bool)((byte)uVar23 & 1);
      auVar33._0_4_ = (uint)bVar27 * auVar29._0_4_ | (uint)!bVar27 * auVar28._0_4_;
      bVar27 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar33._4_4_ = (uint)bVar27 * auVar29._4_4_ | (uint)!bVar27 * auVar28._4_4_;
      bVar27 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar33._8_4_ = (uint)bVar27 * auVar29._8_4_ | (uint)!bVar27 * auVar28._8_4_;
      bVar27 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar33._12_4_ = (uint)bVar27 * auVar29._12_4_ | (uint)!bVar27 * auVar28._12_4_;
      auVar30._8_4_ = 0x3f7ffffa;
      auVar30._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar30._12_4_ = 0x3f7ffffa;
      auVar30 = vmulps_avx512vl(auVar33,auVar30);
      auVar31._8_4_ = 0x3f800003;
      auVar31._0_8_ = 0x3f8000033f800003;
      auVar31._12_4_ = 0x3f800003;
      auVar31 = vmulps_avx512vl(auVar33,auVar31);
      auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar65 = ZEXT3264(auVar50);
      auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar66 = ZEXT3264(auVar50);
      auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar67 = ZEXT3264(auVar50);
      auVar50 = vbroadcastss_avx512vl(auVar30);
      auVar68 = ZEXT3264(auVar50);
      auVar28 = vmovshdup_avx(auVar30);
      auVar50 = vbroadcastsd_avx512vl(auVar28);
      auVar69 = ZEXT3264(auVar50);
      auVar51._8_4_ = 2;
      auVar51._0_8_ = 0x200000002;
      auVar51._12_4_ = 2;
      auVar51._16_4_ = 2;
      auVar51._20_4_ = 2;
      auVar51._24_4_ = 2;
      auVar51._28_4_ = 2;
      auVar29 = vshufpd_avx(auVar30,auVar30,1);
      auVar50 = vpermps_avx2(auVar51,ZEXT1632(auVar30));
      auVar62 = ZEXT3264(auVar50);
      local_1218 = auVar31._0_4_;
      auVar50._8_4_ = 1;
      auVar50._0_8_ = 0x100000001;
      auVar50._12_4_ = 1;
      auVar50._16_4_ = 1;
      auVar50._20_4_ = 1;
      auVar50._24_4_ = 1;
      auVar50._28_4_ = 1;
      auVar50 = vpermps_avx2(auVar50,ZEXT1632(auVar31));
      auVar57 = ZEXT3264(auVar50);
      auVar50 = vpermps_avx2(auVar51,ZEXT1632(auVar31));
      auVar60 = ZEXT3264(auVar50);
      local_1480 = (ulong)(auVar30._0_4_ < 0.0) << 5;
      uVar23 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x40;
      uVar24 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x80;
      uVar25 = local_1480 ^ 0x20;
      uVar53 = auVar49._0_4_;
      auVar56 = ZEXT3264(CONCAT428(uVar53,CONCAT424(uVar53,CONCAT420(uVar53,CONCAT416(uVar53,
                                                  CONCAT412(uVar53,CONCAT48(uVar53,CONCAT44(uVar53,
                                                  uVar53))))))));
      auVar59 = ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416(fVar5,CONCAT412(
                                                  fVar5,CONCAT48(fVar5,CONCAT44(fVar5,fVar5))))))));
      local_14b0 = ray;
      local_1470 = context;
      fStack_1214 = local_1218;
      fStack_1210 = local_1218;
      fStack_120c = local_1218;
      fStack_1208 = local_1218;
      fStack_1204 = local_1218;
      fStack_1200 = local_1218;
      fStack_11fc = local_1218;
      do {
        uVar26 = local_1478[-1];
        local_1478 = local_1478 + -1;
        while ((uVar26 & 8) == 0) {
          auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + local_1480),
                                    auVar65._0_32_);
          auVar50 = vmulps_avx512vl(auVar68._0_32_,auVar50);
          auVar51 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar23),auVar66._0_32_);
          auVar51 = vmulps_avx512vl(auVar69._0_32_,auVar51);
          auVar50 = vmaxps_avx(auVar50,auVar51);
          auVar51 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar24),auVar67._0_32_);
          auVar52._4_4_ = auVar62._4_4_ * auVar51._4_4_;
          auVar52._0_4_ = auVar62._0_4_ * auVar51._0_4_;
          auVar52._8_4_ = auVar62._8_4_ * auVar51._8_4_;
          auVar52._12_4_ = auVar62._12_4_ * auVar51._12_4_;
          auVar52._16_4_ = auVar62._16_4_ * auVar51._16_4_;
          auVar52._20_4_ = auVar62._20_4_ * auVar51._20_4_;
          auVar52._24_4_ = auVar62._24_4_ * auVar51._24_4_;
          auVar52._28_4_ = auVar51._28_4_;
          auVar51 = vmaxps_avx(auVar52,auVar56._0_32_);
          auVar50 = vmaxps_avx(auVar50,auVar51);
          auVar51 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar25),auVar65._0_32_);
          auVar16._4_4_ = fStack_1214 * auVar51._4_4_;
          auVar16._0_4_ = local_1218 * auVar51._0_4_;
          auVar16._8_4_ = fStack_1210 * auVar51._8_4_;
          auVar16._12_4_ = fStack_120c * auVar51._12_4_;
          auVar16._16_4_ = fStack_1208 * auVar51._16_4_;
          auVar16._20_4_ = fStack_1204 * auVar51._20_4_;
          auVar16._24_4_ = fStack_1200 * auVar51._24_4_;
          auVar16._28_4_ = auVar51._28_4_;
          auVar51 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar23 ^ 0x20)),
                                    auVar66._0_32_);
          auVar17._4_4_ = auVar57._4_4_ * auVar51._4_4_;
          auVar17._0_4_ = auVar57._0_4_ * auVar51._0_4_;
          auVar17._8_4_ = auVar57._8_4_ * auVar51._8_4_;
          auVar17._12_4_ = auVar57._12_4_ * auVar51._12_4_;
          auVar17._16_4_ = auVar57._16_4_ * auVar51._16_4_;
          auVar17._20_4_ = auVar57._20_4_ * auVar51._20_4_;
          auVar17._24_4_ = auVar57._24_4_ * auVar51._24_4_;
          auVar17._28_4_ = auVar51._28_4_;
          auVar51 = vminps_avx(auVar16,auVar17);
          auVar52 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar24 ^ 0x20)),
                                    auVar67._0_32_);
          auVar18._4_4_ = auVar60._4_4_ * auVar52._4_4_;
          auVar18._0_4_ = auVar60._0_4_ * auVar52._0_4_;
          auVar18._8_4_ = auVar60._8_4_ * auVar52._8_4_;
          auVar18._12_4_ = auVar60._12_4_ * auVar52._12_4_;
          auVar18._16_4_ = auVar60._16_4_ * auVar52._16_4_;
          auVar18._20_4_ = auVar60._20_4_ * auVar52._20_4_;
          auVar18._24_4_ = auVar60._24_4_ * auVar52._24_4_;
          auVar18._28_4_ = auVar52._28_4_;
          auVar52 = vminps_avx(auVar18,auVar59._0_32_);
          auVar51 = vminps_avx(auVar51,auVar52);
          uVar22 = vcmpps_avx512vl(auVar50,auVar51,2);
          if ((char)uVar22 == '\0') goto LAB_00691f8c;
          uVar19 = uVar26 & 0xfffffffffffffff0;
          lVar20 = 0;
          for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar26 = *(ulong *)(uVar19 + lVar20 * 8);
          uVar21 = (uint)uVar22 - 1 & (uint)uVar22;
          uVar22 = (ulong)uVar21;
          if (uVar21 != 0) {
            *local_1478 = uVar26;
            lVar20 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            uVar21 = uVar21 - 1 & uVar21;
            uVar22 = (ulong)uVar21;
            bVar27 = uVar21 == 0;
            while( true ) {
              local_1478 = local_1478 + 1;
              uVar26 = *(ulong *)(uVar19 + lVar20 * 8);
              if (bVar27) break;
              *local_1478 = uVar26;
              lVar20 = 0;
              for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar22 = uVar22 - 1 & uVar22;
              bVar27 = uVar22 == 0;
            }
          }
        }
        local_1468 = (ulong)((uint)uVar26 & 0xf) - 8;
        if (local_1468 != 0) {
          uVar26 = uVar26 & 0xfffffffffffffff0;
          local_1460 = 0;
          local_11f8 = auVar62._0_32_;
          local_1238 = auVar57._0_32_;
          local_1258 = auVar60._0_32_;
          local_1278 = auVar56._0_32_;
          local_1298 = auVar59._0_32_;
          local_14a0 = local_1470->scene;
          do {
            lVar20 = local_1460 * 0x50;
            ppfVar7 = (local_14a0->vertices).items;
            pfVar8 = ppfVar7[*(uint *)(uVar26 + 0x30 + lVar20)];
            pfVar9 = ppfVar7[*(uint *)(uVar26 + 0x34 + lVar20)];
            pfVar10 = ppfVar7[*(uint *)(uVar26 + 0x38 + lVar20)];
            pfVar11 = ppfVar7[*(uint *)(uVar26 + 0x3c + lVar20)];
            auVar29 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + lVar20)),
                                    *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 8 + lVar20))
                                   );
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + lVar20)),
                                    *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 8 + lVar20))
                                   );
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 4 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0xc + lVar20)));
            auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 4 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0xc + lVar20)));
            auVar31 = vunpcklps_avx(auVar49,auVar28);
            auVar33 = vunpcklps_avx(auVar29,auVar30);
            auVar28 = vunpckhps_avx(auVar29,auVar30);
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar26 + 0x10 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar26 + 0x18 + lVar20)));
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar26 + 0x10 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar26 + 0x18 + lVar20)));
            auVar32 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0x14 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0x1c + lVar20)));
            auVar29 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0x14 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0x1c + lVar20)));
            auVar36 = vunpcklps_avx(auVar49,auVar29);
            auVar34 = vunpcklps_avx(auVar30,auVar32);
            auVar29 = vunpckhps_avx(auVar30,auVar32);
            auVar32 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar26 + 0x20 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar26 + 0x28 + lVar20)));
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar26 + 0x20 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar26 + 0x28 + lVar20)));
            auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0x24 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0x2c + lVar20)));
            auVar30 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0x24 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0x2c + lVar20)));
            auVar38 = vunpcklps_avx(auVar49,auVar30);
            auVar37 = vunpcklps_avx(auVar32,auVar35);
            auVar30 = vunpckhps_avx(auVar32,auVar35);
            puVar4 = (undefined8 *)(uVar26 + 0x30 + lVar20);
            local_13e8 = *puVar4;
            uStack_13e0 = puVar4[1];
            puVar4 = (undefined8 *)(uVar26 + 0x40 + lVar20);
            local_13f8 = *puVar4;
            uStack_13f0 = puVar4[1];
            uVar53 = *(undefined4 *)&(local_14b0->org).field_0;
            auVar39._4_4_ = uVar53;
            auVar39._0_4_ = uVar53;
            auVar39._8_4_ = uVar53;
            auVar39._12_4_ = uVar53;
            uVar53 = *(undefined4 *)((long)&(local_14b0->org).field_0 + 4);
            auVar40._4_4_ = uVar53;
            auVar40._0_4_ = uVar53;
            auVar40._8_4_ = uVar53;
            auVar40._12_4_ = uVar53;
            auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(local_14b0->org).field_0.m128[2]));
            uVar53 = *(undefined4 *)&(local_14b0->dir).field_0;
            auVar58._4_4_ = uVar53;
            auVar58._0_4_ = uVar53;
            auVar58._8_4_ = uVar53;
            auVar58._12_4_ = uVar53;
            uVar53 = *(undefined4 *)((long)&(local_14b0->dir).field_0 + 4);
            auVar61._4_4_ = uVar53;
            auVar61._0_4_ = uVar53;
            auVar61._8_4_ = uVar53;
            auVar61._12_4_ = uVar53;
            local_14b9 = 0;
            fVar5 = (local_14b0->dir).field_0.m128[2];
            auVar63._4_4_ = fVar5;
            auVar63._0_4_ = fVar5;
            auVar63._8_4_ = fVar5;
            auVar63._12_4_ = fVar5;
            auVar49 = vsubps_avx(auVar33,auVar39);
            auVar28 = vsubps_avx(auVar28,auVar40);
            auVar33 = vsubps_avx512vl(auVar31,auVar32);
            auVar34 = vsubps_avx512vl(auVar34,auVar39);
            auVar35 = vsubps_avx512vl(auVar29,auVar40);
            auVar36 = vsubps_avx512vl(auVar36,auVar32);
            auVar29 = vsubps_avx(auVar37,auVar39);
            auVar37 = vsubps_avx512vl(auVar30,auVar40);
            auVar32 = vsubps_avx512vl(auVar38,auVar32);
            auVar30 = vsubps_avx(auVar29,auVar49);
            auVar38 = vsubps_avx512vl(auVar37,auVar28);
            auVar39 = vsubps_avx512vl(auVar32,auVar33);
            auVar40 = vsubps_avx512vl(auVar49,auVar34);
            auVar41 = vsubps_avx512vl(auVar28,auVar35);
            auVar42 = vsubps_avx512vl(auVar33,auVar36);
            auVar43 = vsubps_avx512vl(auVar34,auVar29);
            auVar44 = vsubps_avx512vl(auVar35,auVar37);
            auVar45 = vsubps_avx512vl(auVar36,auVar32);
            auVar48._0_4_ = auVar29._0_4_ + auVar49._0_4_;
            auVar48._4_4_ = auVar29._4_4_ + auVar49._4_4_;
            auVar48._8_4_ = auVar29._8_4_ + auVar49._8_4_;
            auVar48._12_4_ = auVar29._12_4_ + auVar49._12_4_;
            auVar31 = vaddps_avx512vl(auVar37,auVar28);
            auVar46 = vaddps_avx512vl(auVar32,auVar33);
            auVar47 = vmulps_avx512vl(auVar31,auVar39);
            auVar47 = vfmsub231ps_avx512vl(auVar47,auVar38,auVar46);
            auVar46 = vmulps_avx512vl(auVar46,auVar30);
            auVar46 = vfmsub231ps_avx512vl(auVar46,auVar39,auVar48);
            auVar54._0_4_ = auVar38._0_4_ * auVar48._0_4_;
            auVar54._4_4_ = auVar38._4_4_ * auVar48._4_4_;
            auVar54._8_4_ = auVar38._8_4_ * auVar48._8_4_;
            auVar54._12_4_ = auVar38._12_4_ * auVar48._12_4_;
            auVar31 = vfmsub231ps_fma(auVar54,auVar30,auVar31);
            auVar55._0_4_ = fVar5 * auVar31._0_4_;
            auVar55._4_4_ = fVar5 * auVar31._4_4_;
            auVar55._8_4_ = fVar5 * auVar31._8_4_;
            auVar55._12_4_ = fVar5 * auVar31._12_4_;
            auVar31 = vfmadd231ps_avx512vl(auVar55,auVar61,auVar46);
            local_13d8 = vfmadd231ps_avx512vl(auVar31,auVar58,auVar47);
            auVar31 = vaddps_avx512vl(auVar49,auVar34);
            auVar46 = vaddps_avx512vl(auVar28,auVar35);
            auVar47 = vaddps_avx512vl(auVar33,auVar36);
            auVar48 = vmulps_avx512vl(auVar46,auVar42);
            auVar48 = vfmsub231ps_avx512vl(auVar48,auVar41,auVar47);
            auVar47 = vmulps_avx512vl(auVar47,auVar40);
            auVar47 = vfmsub231ps_avx512vl(auVar47,auVar42,auVar31);
            auVar31 = vmulps_avx512vl(auVar31,auVar41);
            auVar31 = vfmsub231ps_avx512vl(auVar31,auVar40,auVar46);
            auVar46._0_4_ = fVar5 * auVar31._0_4_;
            auVar46._4_4_ = fVar5 * auVar31._4_4_;
            auVar46._8_4_ = fVar5 * auVar31._8_4_;
            auVar46._12_4_ = fVar5 * auVar31._12_4_;
            auVar31 = vfmadd231ps_avx512vl(auVar46,auVar61,auVar47);
            local_13c8 = vfmadd231ps_avx512vl(auVar31,auVar58,auVar48);
            auVar31 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar29 = vaddps_avx512vl(auVar34,auVar29);
            auVar34 = vaddps_avx512vl(auVar35,auVar37);
            auVar32 = vaddps_avx512vl(auVar36,auVar32);
            auVar36 = vmulps_avx512vl(auVar34,auVar45);
            auVar36 = vfmsub231ps_avx512vl(auVar36,auVar44,auVar32);
            auVar32 = vmulps_avx512vl(auVar32,auVar43);
            auVar32 = vfmsub231ps_avx512vl(auVar32,auVar45,auVar29);
            auVar35._0_4_ = auVar29._0_4_ * auVar44._0_4_;
            auVar35._4_4_ = auVar29._4_4_ * auVar44._4_4_;
            auVar35._8_4_ = auVar29._8_4_ * auVar44._8_4_;
            auVar35._12_4_ = auVar29._12_4_ * auVar44._12_4_;
            auVar29 = vfmsub231ps_avx512vl(auVar35,auVar43,auVar34);
            auVar29 = vmulps_avx512vl(auVar63,auVar29);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar61,auVar32);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar58,auVar36);
            auVar34._0_4_ = local_13d8._0_4_ + local_13c8._0_4_;
            auVar34._4_4_ = local_13d8._4_4_ + local_13c8._4_4_;
            auVar34._8_4_ = local_13d8._8_4_ + local_13c8._8_4_;
            auVar34._12_4_ = local_13d8._12_4_ + local_13c8._12_4_;
            local_13b8 = vaddps_avx512vl(auVar29,auVar34);
            auVar34 = vandps_avx512vl(local_13b8,auVar31);
            auVar32._8_4_ = 0x34000000;
            auVar32._0_8_ = 0x3400000034000000;
            auVar32._12_4_ = 0x34000000;
            auVar32 = vmulps_avx512vl(auVar34,auVar32);
            auVar36 = vminps_avx512vl(local_13d8,local_13c8);
            auVar35 = vminps_avx512vl(auVar36,auVar29);
            auVar36._8_4_ = 0x80000000;
            auVar36._0_8_ = 0x8000000080000000;
            auVar36._12_4_ = 0x80000000;
            auVar36 = vxorps_avx512vl(auVar32,auVar36);
            uVar12 = vcmpps_avx512vl(auVar35,auVar36,5);
            auVar36 = vmaxps_avx512vl(local_13d8,local_13c8);
            auVar29 = vmaxps_avx512vl(auVar36,auVar29);
            uVar13 = vcmpps_avx512vl(auVar29,auVar32,2);
            local_13a0 = ((byte)uVar12 | (byte)uVar13) & 0xf;
            if (local_13a0 != 0) {
              auVar29 = vmulps_avx512vl(auVar39,auVar41);
              auVar32 = vmulps_avx512vl(auVar30,auVar42);
              auVar36 = vmulps_avx512vl(auVar38,auVar40);
              auVar35 = vmulps_avx512vl(auVar42,auVar44);
              auVar37 = vmulps_avx512vl(auVar40,auVar45);
              auVar46 = vmulps_avx512vl(auVar41,auVar43);
              auVar38 = vfmsub213ps_avx512vl(auVar38,auVar42,auVar29);
              auVar39 = vfmsub213ps_avx512vl(auVar39,auVar40,auVar32);
              auVar30 = vfmsub213ps_avx512vl(auVar30,auVar41,auVar36);
              auVar41 = vfmsub213ps_avx512vl(auVar45,auVar41,auVar35);
              auVar42 = vfmsub213ps_avx512vl(auVar43,auVar42,auVar37);
              auVar40 = vfmsub213ps_avx512vl(auVar44,auVar40,auVar46);
              auVar29 = vandps_avx512vl(auVar29,auVar31);
              auVar35 = vandps_avx512vl(auVar35,auVar31);
              uVar22 = vcmpps_avx512vl(auVar29,auVar35,1);
              auVar29 = vandps_avx512vl(auVar32,auVar31);
              auVar32 = vandps_avx512vl(auVar37,auVar31);
              uVar19 = vcmpps_avx512vl(auVar29,auVar32,1);
              auVar29 = vandps_avx512vl(auVar36,auVar31);
              auVar31 = vandps_avx512vl(auVar46,auVar31);
              uVar14 = vcmpps_avx512vl(auVar29,auVar31,1);
              bVar27 = (bool)((byte)uVar22 & 1);
              local_1368._0_4_ = (uint)bVar27 * auVar38._0_4_ | (uint)!bVar27 * auVar41._0_4_;
              bVar27 = (bool)((byte)(uVar22 >> 1) & 1);
              local_1368._4_4_ = (uint)bVar27 * auVar38._4_4_ | (uint)!bVar27 * auVar41._4_4_;
              bVar27 = (bool)((byte)(uVar22 >> 2) & 1);
              local_1368._8_4_ = (uint)bVar27 * auVar38._8_4_ | (uint)!bVar27 * auVar41._8_4_;
              bVar27 = (bool)((byte)(uVar22 >> 3) & 1);
              local_1368._12_4_ = (uint)bVar27 * auVar38._12_4_ | (uint)!bVar27 * auVar41._12_4_;
              bVar27 = (bool)((byte)uVar19 & 1);
              local_1358._0_4_ = (uint)bVar27 * auVar39._0_4_ | (uint)!bVar27 * auVar42._0_4_;
              bVar27 = (bool)((byte)(uVar19 >> 1) & 1);
              local_1358._4_4_ = (uint)bVar27 * auVar39._4_4_ | (uint)!bVar27 * auVar42._4_4_;
              bVar27 = (bool)((byte)(uVar19 >> 2) & 1);
              local_1358._8_4_ = (uint)bVar27 * auVar39._8_4_ | (uint)!bVar27 * auVar42._8_4_;
              bVar27 = (bool)((byte)(uVar19 >> 3) & 1);
              local_1358._12_4_ = (uint)bVar27 * auVar39._12_4_ | (uint)!bVar27 * auVar42._12_4_;
              bVar27 = (bool)((byte)uVar14 & 1);
              local_1348._0_4_ =
                   (float)((uint)bVar27 * auVar30._0_4_ | (uint)!bVar27 * auVar40._0_4_);
              bVar27 = (bool)((byte)(uVar14 >> 1) & 1);
              local_1348._4_4_ =
                   (float)((uint)bVar27 * auVar30._4_4_ | (uint)!bVar27 * auVar40._4_4_);
              bVar27 = (bool)((byte)(uVar14 >> 2) & 1);
              local_1348._8_4_ =
                   (float)((uint)bVar27 * auVar30._8_4_ | (uint)!bVar27 * auVar40._8_4_);
              bVar27 = (bool)((byte)(uVar14 >> 3) & 1);
              local_1348._12_4_ =
                   (float)((uint)bVar27 * auVar30._12_4_ | (uint)!bVar27 * auVar40._12_4_);
              auVar43._0_4_ = fVar5 * local_1348._0_4_;
              auVar43._4_4_ = fVar5 * local_1348._4_4_;
              auVar43._8_4_ = fVar5 * local_1348._8_4_;
              auVar43._12_4_ = fVar5 * local_1348._12_4_;
              auVar29 = vfmadd213ps_fma(auVar61,local_1358,auVar43);
              auVar29 = vfmadd213ps_fma(auVar58,local_1368,auVar29);
              auVar41._0_4_ = auVar29._0_4_ + auVar29._0_4_;
              auVar41._4_4_ = auVar29._4_4_ + auVar29._4_4_;
              auVar41._8_4_ = auVar29._8_4_ + auVar29._8_4_;
              auVar41._12_4_ = auVar29._12_4_ + auVar29._12_4_;
              auVar42._0_4_ = auVar33._0_4_ * local_1348._0_4_;
              auVar42._4_4_ = auVar33._4_4_ * local_1348._4_4_;
              auVar42._8_4_ = auVar33._8_4_ * local_1348._8_4_;
              auVar42._12_4_ = auVar33._12_4_ * local_1348._12_4_;
              auVar28 = vfmadd213ps_fma(auVar28,local_1358,auVar42);
              auVar28 = vfmadd213ps_fma(auVar49,local_1368,auVar28);
              auVar49 = vrcp14ps_avx512vl(auVar41);
              auVar30 = auVar64._0_16_;
              auVar29 = vfnmadd213ps_avx512vl(auVar49,auVar41,auVar30);
              auVar49 = vfmadd132ps_fma(auVar29,auVar49,auVar49);
              local_1378._0_4_ = auVar49._0_4_ * (auVar28._0_4_ + auVar28._0_4_);
              local_1378._4_4_ = auVar49._4_4_ * (auVar28._4_4_ + auVar28._4_4_);
              local_1378._8_4_ = auVar49._8_4_ * (auVar28._8_4_ + auVar28._8_4_);
              local_1378._12_4_ = auVar49._12_4_ * (auVar28._12_4_ + auVar28._12_4_);
              uVar53 = *(undefined4 *)((long)&(local_14b0->org).field_0 + 0xc);
              auVar49._4_4_ = uVar53;
              auVar49._0_4_ = uVar53;
              auVar49._8_4_ = uVar53;
              auVar49._12_4_ = uVar53;
              uVar12 = vcmpps_avx512vl(local_1378,auVar49,0xd);
              auVar38._8_4_ = 0x80000000;
              auVar38._0_8_ = 0x8000000080000000;
              auVar38._12_4_ = 0x80000000;
              auVar49 = vxorps_avx512vl(auVar41,auVar38);
              fVar5 = local_14b0->tfar;
              auVar37._4_4_ = fVar5;
              auVar37._0_4_ = fVar5;
              auVar37._8_4_ = fVar5;
              auVar37._12_4_ = fVar5;
              uVar13 = vcmpps_avx512vl(local_1378,auVar37,2);
              uVar15 = vcmpps_avx512vl(auVar41,auVar49,4);
              local_13a0 = (byte)uVar12 & (byte)uVar13 & (byte)uVar15 & local_13a0;
              if (local_13a0 != 0) {
                auVar44._8_4_ = 0x219392ef;
                auVar44._0_8_ = 0x219392ef219392ef;
                auVar44._12_4_ = 0x219392ef;
                uVar22 = vcmpps_avx512vl(auVar34,auVar44,5);
                auVar49 = vrcp14ps_avx512vl(local_13b8);
                auVar28 = vfnmadd213ps_avx512vl(local_13b8,auVar49,auVar30);
                auVar49 = vfmadd132ps_avx512vl(auVar28,auVar49,auVar49);
                fVar5 = (float)((uint)((byte)uVar22 & 1) * auVar49._0_4_);
                fVar1 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar49._4_4_);
                fVar2 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar49._8_4_);
                fVar3 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar49._12_4_);
                local_13a8 = &local_14b9;
                auVar45._0_4_ = fVar5 * local_13d8._0_4_;
                auVar45._4_4_ = fVar1 * local_13d8._4_4_;
                auVar45._8_4_ = fVar2 * local_13d8._8_4_;
                auVar45._12_4_ = fVar3 * local_13d8._12_4_;
                local_1398 = vminps_avx512vl(auVar45,auVar30);
                auVar47._0_4_ = fVar5 * local_13c8._0_4_;
                auVar47._4_4_ = fVar1 * local_13c8._4_4_;
                auVar47._8_4_ = fVar2 * local_13c8._8_4_;
                auVar47._12_4_ = fVar3 * local_13c8._12_4_;
                local_1388 = vminps_avx512vl(auVar47,auVar30);
                local_1488 = (ulong)local_13a0;
                do {
                  local_1490 = 0;
                  for (uVar22 = local_1488; (uVar22 & 1) == 0;
                      uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                    local_1490 = local_1490 + 1;
                  }
                  local_1440 = *(uint *)((long)&local_13e8 + local_1490 * 4);
                  local_1498 = (local_14a0->geometries).items[local_1440].ptr;
                  if ((local_1498->mask & local_14b0->mask) == 0) {
                    local_1488 = local_1488 ^ 1L << (local_1490 & 0x3f);
                  }
                  else {
                    if ((local_1470->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_1498->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00691f9c:
                      local_14b0->tfar = -INFINITY;
                      return;
                    }
                    local_14a8 = local_1470->args;
                    local_1338 = auVar69._0_32_;
                    local_1318 = auVar68._0_32_;
                    local_12f8 = auVar67._0_32_;
                    local_12d8 = auVar66._0_32_;
                    local_12b8 = auVar65._0_32_;
                    uVar22 = (ulong)(uint)((int)local_1490 * 4);
                    local_1428.context = local_1470->user;
                    local_1458 = *(undefined4 *)(local_1368 + uVar22);
                    local_1454 = *(undefined4 *)(local_1358 + uVar22);
                    local_1450 = *(undefined4 *)(local_1348 + uVar22);
                    local_144c = *(undefined4 *)(local_1398 + uVar22);
                    local_1448 = *(undefined4 *)(local_1388 + uVar22);
                    local_1444 = *(undefined4 *)((long)&local_13f8 + uVar22);
                    local_143c = (local_1428.context)->instID[0];
                    local_1438 = (local_1428.context)->instPrimID[0];
                    local_14b8 = local_14b0->tfar;
                    local_14b0->tfar = *(float *)(local_1378 + uVar22);
                    local_14b4 = -1;
                    local_1428.valid = &local_14b4;
                    local_1428.geometryUserPtr = local_1498->userPtr;
                    local_1428.hit = (RTCHitN *)&local_1458;
                    local_1428.N = 1;
                    local_1428.ray = (RTCRayN *)local_14b0;
                    if (((local_1498->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_1498->occlusionFilterN)(&local_1428), *local_1428.valid != 0)) &&
                       ((local_14a8->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_14a8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_1498->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_14a8->filter)(&local_1428), *local_1428.valid != 0))))))
                    goto LAB_00691f9c;
                    local_14b0->tfar = local_14b8;
                    local_1488 = local_1488 ^ 1L << (local_1490 & 0x3f);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar64 = ZEXT1664(auVar49);
                    auVar65 = ZEXT3264(local_12b8);
                    auVar66 = ZEXT3264(local_12d8);
                    auVar67 = ZEXT3264(local_12f8);
                    auVar68 = ZEXT3264(local_1318);
                    auVar69 = ZEXT3264(local_1338);
                  }
                } while (local_1488 != 0);
              }
            }
            local_1460 = local_1460 + 1;
            auVar62 = ZEXT3264(local_11f8);
            auVar57 = ZEXT3264(local_1238);
            auVar60 = ZEXT3264(local_1258);
            auVar56 = ZEXT3264(local_1278);
            auVar59 = ZEXT3264(local_1298);
          } while (local_1460 != local_1468);
        }
LAB_00691f8c:
      } while (local_1478 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }